

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O1

VarId __thiscall
optimization::global_var_to_local::get_new_id(global_var_to_local *this,MirFunction *f,Variable *v)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_bool> pVar3;
  VarId VVar4;
  pair<const_unsigned_int,_mir::inst::Variable> local_48;
  
  lVar1 = std::_Rb_tree_decrement(&(f->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  local_48.first = *(int *)(lVar1 + 0x20) + 1;
  *(undefined ***)this = &PTR_display_001ee058;
  *(uint *)(this + 8) = local_48.first;
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (v->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (v->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.second.is_memory_var = v->is_memory_var;
  local_48.second.is_temp_var = v->is_temp_var;
  local_48.second.is_phi_var = v->is_phi_var;
  local_48.second._27_1_ = v->field_0x1b;
  local_48.second.priority = v->priority;
  pVar3 = std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
          ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
                      *)&f->variables,&local_48);
  uVar2 = pVar3._8_8_;
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
  if (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar2 = extraout_RDX;
  }
  VVar4._8_8_ = uVar2;
  VVar4.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar4;
}

Assistant:

mir::inst::VarId get_new_id(mir::inst::MirFunction& f, mir::inst::Variable v) {
  auto end = f.variables.end();
  end--;
  auto id = mir::inst::VarId(end->first + 1);
  f.variables.insert({id.id, v});
  return id;
}